

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall toml::detail::location::retrace(location *this,difference_type n)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  difference_type dVar1;
  undefined1 local_11;
  
  __last._M_current = (this->iter_)._M_current;
  dVar1 = std::
          __count_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (__last._M_current + -n),__last,(_Iter_equals_val<const_char>)&local_11);
  this->line_number_ = this->line_number_ - dVar1;
  (this->iter_)._M_current = (this->iter_)._M_current + -n;
  return;
}

Assistant:

void retrace(difference_type n = 1) noexcept
    {
        this->line_number_ -= static_cast<std::size_t>(
                std::count(std::prev(this->iter_, n), this->iter_, '\n'));
        this->iter_ -= n;
        return;
    }